

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O2

bool __thiscall CaDiCaL::block_more_occs_size::operator()(block_more_occs_size *this,uint a,uint b)

{
  pointer plVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = a >> 1;
  uVar5 = -uVar4;
  if ((a & 1) == 0) {
    uVar5 = uVar4;
  }
  plVar1 = (this->internal->ntab).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = b >> 1;
  uVar2 = -uVar6;
  if ((b & 1) == 0) {
    uVar2 = uVar6;
  }
  bVar3 = true;
  if ((ulong)plVar1[-uVar5 >> 0x1f | uVar4 << 1] <= (ulong)plVar1[-uVar2 >> 0x1f | uVar6 << 1]) {
    if ((ulong)plVar1[-uVar5 >> 0x1f | uVar4 << 1] < (ulong)plVar1[-uVar2 >> 0x1f | uVar6 << 1]) {
      bVar3 = false;
    }
    else if ((ulong)plVar1[uVar4 << 1 | uVar5 >> 0x1f] <= (ulong)plVar1[uVar6 << 1 | uVar2 >> 0x1f])
    {
      bVar3 = b < a && (ulong)plVar1[uVar6 << 1 | uVar2 >> 0x1f] <=
                       (ulong)plVar1[uVar4 << 1 | uVar5 >> 0x1f];
    }
  }
  return bVar3;
}

Assistant:

inline bool block_more_occs_size::operator() (unsigned a, unsigned b) {
  size_t s = internal->noccs (-internal->u2i (a));
  size_t t = internal->noccs (-internal->u2i (b));
  if (s > t)
    return true;
  if (s < t)
    return false;
  s = internal->noccs (internal->u2i (a));
  t = internal->noccs (internal->u2i (b));
  if (s > t)
    return true;
  if (s < t)
    return false;
  return a > b;
}